

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O0

SelectionSet * __thiscall
OpenMD::SelectionEvaluator::lookupValue(SelectionEvaluator *this,string *variable)

{
  bool bVar1;
  any *in_RDI;
  iterator i;
  SelectionSet bs;
  int in_stack_000001ac;
  vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *in_stack_000001b0;
  SelectionEvaluator *in_stack_000001b8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  *in_stack_ffffffffffffff48;
  any *this_00;
  SelectionEvaluator *in_stack_ffffffffffffff88;
  SelectionEvaluator *in_stack_ffffffffffffff90;
  pointer in_stack_ffffffffffffff98;
  _Self local_50 [3];
  _Self local_38;
  SelectionSet local_30 [2];
  
  this_00 = in_RDI;
  createSelectionSets(in_stack_ffffffffffffff88);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
       ::find(in_stack_ffffffffffffff48,(key_type *)0x3c29df);
  local_50[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
       ::end(in_stack_ffffffffffffff48);
  bVar1 = std::operator!=(&local_38,local_50);
  if (bVar1) {
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>
                  *)0x3c2a31);
    std::any::type(in_RDI);
    bVar1 = std::type_info::operator==((type_info *)this_00,(type_info *)in_RDI);
    if (bVar1) {
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>
                    *)0x3c2a5f);
      std::any_cast<OpenMD::SelectionSet>(in_RDI);
      goto LAB_003c2bba;
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>
                  *)0x3c2a9f);
    std::any::type(in_RDI);
    bVar1 = std::type_info::operator==((type_info *)this_00,(type_info *)in_RDI);
    if (bVar1) {
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>
                    *)0x3c2ad0);
      std::any_cast<std::vector<OpenMD::Token,std::allocator<OpenMD::Token>>>(in_RDI);
      expression(in_stack_000001b8,in_stack_000001b0,in_stack_000001ac);
      SelectionSet::operator=(local_30,(SelectionSet *)&stack0xffffffffffffff90);
      SelectionSet::~SelectionSet((SelectionSet *)0x3c2b22);
      std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::~vector
                ((vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *)this_00);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>
                    *)0x3c2b39);
      std::any::operator=(this_00,(SelectionSet *)in_RDI);
      SelectionSet::parallelReduce((SelectionSet *)in_stack_ffffffffffffff98);
      goto LAB_003c2bba;
    }
  }
  else {
    unrecognizedIdentifier(in_stack_ffffffffffffff90,(string *)in_stack_ffffffffffffff88);
  }
  SelectionSet::parallelReduce((SelectionSet *)in_stack_ffffffffffffff98);
LAB_003c2bba:
  SelectionSet::~SelectionSet((SelectionSet *)0x3c2bc7);
  return (SelectionSet *)this_00;
}

Assistant:

SelectionSet SelectionEvaluator::lookupValue(const std::string& variable) {
    SelectionSet bs                             = createSelectionSets();
    std::map<std::string, std::any>::iterator i = variables.find(variable);

    if (i != variables.end()) {
      if (i->second.type() == typeid(SelectionSet)) {
        return std::any_cast<SelectionSet>(i->second);
      } else if (i->second.type() == typeid(std::vector<Token>)) {
        bs        = expression(std::any_cast<std::vector<Token>>(i->second), 2);
        i->second = bs; /**@todo fixme */
        return bs.parallelReduce();
      }
    } else {
      unrecognizedIdentifier(variable);
    }

    return bs.parallelReduce();
  }